

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<ki::protocol::dml::MessageModule> * __thiscall
pybind11::class_<ki::protocol::dml::MessageModule>::
def<ki::protocol::dml::MessageTemplate_const*(ki::protocol::dml::MessageModule::*)(std::__cxx11::string,ki::dml::Record*,bool),pybind11::return_value_policy>
          (class_<ki::protocol::dml::MessageModule> *this,char *name_,offset_in_Message_to_subr *f,
          return_value_policy *extra)

{
  offset_in_Message_to_subr f_00;
  name *extra_00;
  cpp_function cf;
  handle local_68;
  cpp_function local_60;
  handle local_58;
  object local_50;
  obj_attr_accessor local_48;
  PyObject *local_28;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_68.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48._0_8_ = name_;
  getattr((pybind11 *)&local_58,local_68,name_,(PyObject *)&_Py_NoneStruct);
  local_28 = local_58.m_ptr;
  cpp_function::
  cpp_function<ki::protocol::dml::MessageTemplate_const*,ki::protocol::dml::MessageModule,std::__cxx11::string,ki::dml::Record*,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
            (&local_60,f_00,extra_00,(is_method *)&local_48,(sibling *)&local_68,
             (return_value_policy *)&local_28);
  object::~object((object *)&local_58);
  object::~object(&local_50);
  cpp_function::name((cpp_function *)&local_68);
  detail::object_api<pybind11::handle>::attr
            (&local_48,(object_api<pybind11::handle> *)this,local_68);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_48,&local_60);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_48);
  object::~object((object *)&local_68);
  object::~object((object *)&local_60);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }